

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

u32 mode3_tick_count(Emulator *e)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  u32 local_8c;
  int bucket;
  u8 x;
  Obj *o;
  int i;
  Bool has_zero;
  u32 ticks;
  u8 scx_fine;
  s32 buckets [22];
  Emulator *e_local;
  
  buckets._80_8_ = e;
  memset(&ticks,0,0x58);
  bVar2 = *(byte *)(buckets._80_8_ + 0x3388d) & 7;
  i = bVar2 + 0xac;
  bVar1 = false;
  for (o._0_4_ = 0; (int)o < (int)(uint)*(byte *)(buckets._80_8_ + 0x33b3c); o._0_4_ = (int)o + 1) {
    bVar3 = *(char *)(buckets._80_8_ + (long)(int)o * 0x14 + 0x33a75) + 8;
    if (bVar3 < 0xa8) {
      if ((!bVar1) && (bVar3 == 0)) {
        bVar1 = true;
        i = (uint)bVar2 + i;
      }
      bVar3 = bVar3 + bVar2;
      iVar4 = (int)(uint)bVar3 >> 3;
      if ((int)(5 - (bVar3 & 7)) < (int)(&ticks)[iVar4]) {
        local_8c = (&ticks)[iVar4];
      }
      else {
        local_8c = 5 - (bVar3 & 7);
      }
      (&ticks)[iVar4] = local_8c;
      i = i + 6;
    }
  }
  for (o._0_4_ = 0; (int)o < 0x16; o._0_4_ = (int)o + 1) {
    i = (&ticks)[(int)o] + i;
  }
  return i;
}

Assistant:

static u32 mode3_tick_count(Emulator* e) {
  s32 buckets[SCREEN_WIDTH / 8 + 2];
  ZERO_MEMORY(buckets);
  u8 scx_fine = PPU.scx & 7;
  u32 ticks = PPU_MODE3_MIN_TICKS + scx_fine;
  Bool has_zero = FALSE;
  int i;
  for (i = 0; i < PPU.line_obj_count; ++i) {
    Obj* o = &PPU.line_obj[i];
    u8 x = o->x + OBJ_X_OFFSET;
    if (x >= SCREEN_WIDTH + OBJ_X_OFFSET) {
      continue;
    }
    if (!has_zero && x == 0) {
      has_zero = TRUE;
      ticks += scx_fine;
    }
    x += scx_fine;
    int bucket = x >> 3;
    buckets[bucket] = MAX(buckets[bucket], 5 - (x & 7));
    ticks += 6;
  }
  for (i = 0; i < (int)ARRAY_SIZE(buckets); ++i) {
    ticks += buckets[i];
  }
  return ticks;
}